

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O0

int __thiscall Wave::get_min_entropy(Wave *this,minstd_rand *gen)

{
  double dVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  long in_RDI;
  double noise;
  double entropy;
  double nb_patterns_local;
  uint i;
  int argmin;
  double min;
  uniform_real_distribution<double> dis;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_stack_ffffffffffffff98;
  uniform_real_distribution<double> *in_stack_ffffffffffffffa0;
  uint local_38;
  uint local_34;
  double local_30;
  uint local_4;
  
  if ((*(byte *)(in_RDI + 0xb0) & 1) == 0) {
    std::uniform_real_distribution<double>::uniform_real_distribution
              (in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98,5.49158411943358e-318);
    local_30 = std::numeric_limits<double>::infinity();
    local_34 = 0xffffffff;
    for (local_38 = 0; local_38 < *(uint *)(in_RDI + 0xf0); local_38 = local_38 + 1) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x80),
                          (ulong)local_38);
      if (((double)*pvVar2 != 1.0) || (NAN((double)*pvVar2))) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x98),
                            (ulong)local_38);
        dVar1 = *pvVar3;
        if ((dVar1 <= local_30) &&
           (in_stack_ffffffffffffffa0 =
                 (uniform_real_distribution<double> *)
                 std::uniform_real_distribution<double>::operator()
                           (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98),
           dVar1 + (double)in_stack_ffffffffffffffa0 < local_30)) {
          local_30 = dVar1 + (double)in_stack_ffffffffffffffa0;
          local_34 = local_38;
        }
      }
    }
    local_4 = local_34;
  }
  else {
    local_4 = 0xfffffffe;
  }
  return local_4;
}

Assistant:

int Wave::get_min_entropy(std::minstd_rand &gen) const noexcept {
  if (is_impossible) {
    return -2;
  }

  std::uniform_real_distribution<> dis(0, min_abs_half_plogp);

  // The minimum entropy (plus a small noise)
  double min = std::numeric_limits<double>::infinity();
  int argmin = -1;

  for (unsigned i = 0; i < size; i++) {

    // If the cell is decided, we do not compute the entropy (which is equal
    // to 0).
    double nb_patterns_local = memoisation.nb_patterns[i];
    if (nb_patterns_local == 1) {
      continue;
    }

    // Otherwise, we take the memoised entropy.
    double entropy = memoisation.entropy[i];

    // We first check if the entropy is less than the minimum.
    // This is important to reduce noise computation (which is not
    // negligible).
    if (entropy <= min) {

      // Then, we add noise to decide randomly which will be chosen.
      // noise is smaller than the smallest p * log(p), so the minimum entropy
      // will always be chosen.
      double noise = dis(gen);
      if (entropy + noise < min) {
        min = entropy + noise;
        argmin = i;
      }
    }
  }

  return argmin;
}